

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O1

void __thiscall Imf_2_5::SampleCountChannel::clear(SampleCountChannel *this)

{
  uint *puVar1;
  uint *puVar2;
  size_t *psVar3;
  ulong uVar4;
  
  if ((this->super_ImageChannel)._numPixels != 0) {
    puVar1 = this->_numSamples;
    puVar2 = this->_sampleListSizes;
    psVar3 = this->_sampleListPositions;
    uVar4 = 0;
    do {
      puVar1[uVar4] = 0;
      puVar2[uVar4] = 0;
      psVar3[uVar4] = 0;
      uVar4 = uVar4 + 1;
    } while (uVar4 < (this->super_ImageChannel)._numPixels);
  }
  this->_totalNumSamples = 0;
  this->_totalSamplesOccupied = 0;
  this->_sampleBufferSize = 0;
  DeepImageLevel::initializeSampleLists((DeepImageLevel *)(this->super_ImageChannel)._level);
  return;
}

Assistant:

void
SampleCountChannel::clear ()
{
    try
    {
        for (size_t i = 0; i < numPixels(); ++i)
        {
            _numSamples[i] = 0;
            _sampleListSizes[i] = 0;
            _sampleListPositions[i] = 0;
        }

        _totalNumSamples = 0;
        _totalSamplesOccupied = 0;
        _sampleBufferSize = roundBufferSizeUp (_totalSamplesOccupied);

        deepLevel().initializeSampleLists();
    }
    catch (...)
    {
        level().image().resize (Box2i (V2i (0, 0), V2i (-1, -1)));
        throw;
    }
}